

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::processMessageFilter(FilterFederate *this,ActionMessage *cmd)

{
  bool bVar1;
  __type _Var2;
  action_t aVar3;
  action_t aVar4;
  element_type *peVar5;
  ActionMessage *this_00;
  GlobalHandle GVar6;
  ActionMessage *in_RSI;
  BaseType *in_RDI;
  GlobalHandle source_1;
  bool returnToSender_1;
  bool destFilter_1;
  string dest;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  uint32_t seqID;
  uint16_t filterCounter;
  GlobalHandle source;
  bool returnToSender;
  bool destFilter;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  iterator __end5;
  iterator __begin5;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *__range5;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  FilterInfo *FiltI;
  FilterFederate *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  undefined1 uVar7;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffb08;
  byte bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  InterfaceHandle local_4bc;
  undefined4 in_stack_fffffffffffffb48;
  GlobalFederateId in_stack_fffffffffffffb4c;
  InterfaceHandle local_49c;
  undefined4 local_498;
  GlobalFederateId local_494;
  GlobalHandle local_490;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_fffffffffffffbf8;
  ActionMessage *in_stack_fffffffffffffc00;
  InterfaceHandle local_254;
  undefined4 local_250;
  GlobalFederateId local_24c;
  undefined1 local_248 [8];
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_240 [7];
  undefined1 local_188 [8];
  undefined1 local_180 [52];
  uint32_t local_14c;
  uint16_t local_146;
  GlobalHandle local_144;
  byte local_13a;
  byte local_139;
  reference local_78;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *local_70;
  __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
  local_68;
  undefined1 *local_60;
  undefined1 local_48 [8];
  undefined1 local_40 [24];
  GlobalHandle local_28;
  FilterInfo *local_20;
  BaseType local_14;
  ActionMessage *local_10;
  
  local_14 = *in_RDI;
  local_10 = in_RSI;
  bVar1 = GlobalFederateId::operator!=(&in_RSI->dest_id,(GlobalFederateId)local_14);
  if (bVar1) {
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)
               CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
               (ActionMessage *)in_stack_fffffffffffffac8);
  }
  else {
    local_28 = ActionMessage::getDest((ActionMessage *)in_stack_fffffffffffffac8);
    GVar6.handle.hid._3_1_ = in_stack_fffffffffffffad7;
    GVar6._0_7_ = in_stack_fffffffffffffad0;
    local_20 = getFilterInfo(in_stack_fffffffffffffac8,GVar6);
    if (local_20 != (FilterInfo *)0x0) {
      *(undefined1 *)((long)in_RDI + 0x285) = 1;
      bVar1 = checkActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                        (local_20,disconnected_flag);
      if ((bVar1) ||
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_20->filterOp),
         !bVar1)) {
        aVar3 = ActionMessage::action(local_10);
        aVar4 = ActionMessage::action(local_10);
        bVar1 = aVar4 == cmd_send_for_filter_return || aVar3 == cmd_send_for_dest_filter_return;
        uVar7 = bVar1;
        GVar6 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffac8);
        if (bVar1) {
          ActionMessage::setDestination(local_10,GVar6);
          aVar4 = cmd_filter_result;
          if (aVar3 == cmd_send_for_dest_filter_return) {
            aVar4 = cmd_dest_filter_result;
          }
          ActionMessage::setAction(local_10,aVar4);
          (local_10->source_handle).hid = (local_20->handle).hid;
          (local_10->source_id).gid = *in_RDI;
          std::function<void_(helics::ActionMessage_&)>::operator()
                    ((function<void_(helics::ActionMessage_&)> *)
                     CONCAT17(uVar7,in_stack_fffffffffffffad0),
                     (ActionMessage *)in_stack_fffffffffffffac8);
        }
        else {
          ActionMessage::setAction(local_10,cmd_send_message);
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffb4c,(GlobalBrokerId)0x0);
          (local_10->dest_id).gid = in_stack_fffffffffffffb4c.gid;
          memset(&local_4bc,0,4);
          InterfaceHandle::InterfaceHandle(&local_4bc);
          (local_10->dest_handle).hid = local_4bc.hid;
          std::function<void_(helics::ActionMessage_&)>::operator()
                    ((function<void_(helics::ActionMessage_&)> *)
                     CONCAT17(uVar7,in_stack_fffffffffffffad0),
                     (ActionMessage *)in_stack_fffffffffffffac8);
        }
      }
      else if ((local_20->cloning & 1U) == 0) {
        aVar3 = ActionMessage::action(local_10);
        local_139 = aVar3 == cmd_send_for_dest_filter_return;
        aVar3 = ActionMessage::action(local_10);
        bVar8 = 1;
        if (aVar3 != cmd_send_for_filter_return) {
          bVar8 = local_139;
        }
        local_13a = bVar8 & 1;
        local_144 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffac8);
        local_146 = local_10->counter;
        local_14c = local_10->sequenceID;
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_20->filterOp);
        if (bVar1) {
          createMessageFromCommand
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffb4c.gid,in_stack_fffffffffffffb48));
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x641023)
          ;
          std::__cxx11::string::string
                    (in_stack_fffffffffffffb10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar8,in_stack_fffffffffffffb08));
          this_00 = (ActionMessage *)
                    std::
                    __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x64104d);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffac8);
          (*(*(_func_int ***)this_00)[2])(local_180,this_00,local_188);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffac8);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffae0);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffae0);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x6410c5);
          if (bVar1) {
            std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       0x6410db);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this_00,in_stack_fffffffffffffae8);
            if ((((_Var2 ^ 0xffU) & 1) == 0) || ((local_139 & 1) == 0)) {
              std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         in_stack_fffffffffffffac8);
              ActionMessage::ActionMessage(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              ActionMessage::operator=
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (ActionMessage *)in_stack_fffffffffffffac8);
              ActionMessage::~ActionMessage
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
              std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         in_stack_fffffffffffffae0);
            }
            else {
              aVar3 = (action_t)((ulong)local_248 >> 0x20);
              std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         in_stack_fffffffffffffac8);
              ActionMessage::ActionMessage(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              in_stack_fffffffffffffae0 = local_240;
              ActionMessage::operator=
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (ActionMessage *)in_stack_fffffffffffffac8);
              ActionMessage::~ActionMessage
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
              std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         in_stack_fffffffffffffae0);
              local_250 = 0;
              GlobalFederateId::GlobalFederateId(&local_24c,(GlobalBrokerId)0x0);
              (local_10->dest_id).gid = local_24c.gid;
              local_254.hid = 0;
              InterfaceHandle::InterfaceHandle(&local_254);
              (local_10->dest_handle).hid = local_254.hid;
              std::function<void_(helics::ActionMessage_&)>::operator()
                        ((function<void_(helics::ActionMessage_&)> *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (ActionMessage *)in_stack_fffffffffffffac8);
              ActionMessage::ActionMessage(this_00,aVar3);
              ActionMessage::operator=
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                         (ActionMessage *)in_stack_fffffffffffffac8);
              ActionMessage::~ActionMessage
                        ((ActionMessage *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
            }
          }
          else {
            ActionMessage::ActionMessage
                      (this_00,(action_t)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            ActionMessage::operator=
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
            ActionMessage::~ActionMessage
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffae0);
        }
        if ((local_13a & 1) == 0) {
          aVar3 = ActionMessage::action(local_10);
          if (aVar3 != cmd_ignore) {
            local_490 = local_144;
            ActionMessage::setSource(local_10,local_144);
            local_498 = 0;
            GlobalFederateId::GlobalFederateId(&local_494,(GlobalBrokerId)0x0);
            (local_10->dest_id).gid = local_494.gid;
            memset(&local_49c,0,4);
            InterfaceHandle::InterfaceHandle(&local_49c);
            (local_10->dest_handle).hid = local_49c.hid;
            std::function<void_(helics::ActionMessage_&)>::operator()
                      ((function<void_(helics::ActionMessage_&)> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
          }
        }
        else {
          ActionMessage::setDestination(local_10,local_144);
          local_10->counter = local_146;
          local_10->sequenceID = local_14c;
          (local_10->source_handle).hid = (local_20->handle).hid;
          (local_10->source_id).gid = *in_RDI;
          aVar3 = ActionMessage::action(local_10);
          if (aVar3 == cmd_ignore) {
            aVar3 = cmd_null_message;
            if ((local_139 & 1) != 0) {
              aVar3 = cmd_null_dest_message;
            }
            ActionMessage::setAction(local_10,aVar3);
            std::function<void_(helics::ActionMessage_&)>::operator()
                      ((function<void_(helics::ActionMessage_&)> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
          }
          else {
            aVar3 = cmd_filter_result;
            if ((local_139 & 1) != 0) {
              aVar3 = cmd_dest_filter_result;
            }
            ActionMessage::setAction(local_10,aVar3);
            std::function<void_(helics::ActionMessage_&)>::operator()
                      ((function<void_(helics::ActionMessage_&)> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
          }
        }
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x640d73);
        createMessageFromCommand
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffb4c.gid,in_stack_fffffffffffffb48));
        (*peVar5->_vptr_FilterOperator[3])(local_40,peVar5,local_48);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffffae0);
        local_60 = local_40;
        local_68._M_current =
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             std::
             vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ::begin((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                      *)in_stack_fffffffffffffac8);
        local_70 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   std::
                   vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   ::end((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                          *)in_stack_fffffffffffffac8);
        while (bVar1 = __gnu_cxx::
                       operator==<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                 ((__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                                  (__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                   *)in_stack_fffffffffffffac8), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_78 = __gnu_cxx::
                     __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                     ::operator*(&local_68);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x640e38);
          if (bVar1) {
            std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       in_stack_fffffffffffffac8);
            ActionMessage::ActionMessage(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            ActionMessage::operator=
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
            ActionMessage::~ActionMessage
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
            std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                      ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       in_stack_fffffffffffffae0);
            std::function<void_(helics::ActionMessage_&)>::operator()
                      ((function<void_(helics::ActionMessage_&)> *)
                       CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                       (ActionMessage *)in_stack_fffffffffffffac8);
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
          ::operator++(&local_68);
        }
        std::
        vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ::~vector(in_stack_fffffffffffffae0);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processMessageFilter(ActionMessage& cmd)
{
    if (cmd.dest_id != mFedID) {
        mSendMessage(cmd);
    } else {
        // deal with local source filters
        auto* FiltI = getFilterInfo(cmd.getDest());
        if (FiltI != nullptr) {
            mCoord.triggered = true;
            if ((!checkActionFlag(*FiltI, disconnected_flag)) && (FiltI->filterOp)) {
                if (FiltI->cloning) {
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(std::move(cmd)));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            cmd = ActionMessage(std::move(msg));
                            mDeliverMessage(cmd);
                        }
                    }
                } else {
                    bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    bool returnToSender =
                        ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                    auto source = cmd.getSource();
                    auto filterCounter = cmd.counter;
                    auto seqID = cmd.sequenceID;
                    if (FiltI->filterOp) {
                        auto tempMessage = createMessageFromCommand(std::move(cmd));
                        auto dest = tempMessage->dest;
                        tempMessage = FiltI->filterOp->process(std::move(tempMessage));

                        if (tempMessage) {
                            if (tempMessage->dest != dest && destFilter) {
                                // the destination was altered we need to start the process over
                                cmd = ActionMessage(std::move(tempMessage));
                                cmd.dest_id = parent_broker_id;
                                cmd.dest_handle = InterfaceHandle{};
                                mDeliverMessage(cmd);
                                cmd = CMD_IGNORE;
                            } else {
                                cmd = ActionMessage(std::move(tempMessage));
                            }
                        } else {
                            cmd = CMD_IGNORE;
                        }
                    }

                    if (!returnToSender) {
                        if (cmd.action() == CMD_IGNORE) {
                            return;
                        }
                        cmd.setSource(source);
                        cmd.dest_id = parent_broker_id;
                        cmd.dest_handle = InterfaceHandle();
                        mDeliverMessage(cmd);
                    } else {
                        cmd.setDestination(source);
                        cmd.counter = filterCounter;
                        cmd.sequenceID = seqID;
                        cmd.source_handle = FiltI->handle;
                        cmd.source_id = mFedID;
                        if (cmd.action() == CMD_IGNORE) {
                            cmd.setAction(destFilter ? CMD_NULL_DEST_MESSAGE : CMD_NULL_MESSAGE);

                            mDeliverMessage(cmd);
                            return;
                        }
                        cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                        mDeliverMessage(cmd);
                    }
                }
            } else {
                // the filter didn't have a function or was deactivated but still was requested to
                // process
                bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                bool returnToSender =
                    ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                auto source = cmd.getSource();
                if (!returnToSender) {
                    cmd.setAction(CMD_SEND_MESSAGE);
                    cmd.dest_id = parent_broker_id;
                    cmd.dest_handle = InterfaceHandle();
                    mDeliverMessage(cmd);
                } else {
                    cmd.setDestination(source);
                    cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                    cmd.source_handle = FiltI->handle;
                    cmd.source_id = mFedID;
                    mDeliverMessage(cmd);
                }
            }
        } else {
            assert(false);
            // this is an odd condition (not sure what to do yet)
            /*    m.dest_id = filtFunc->sourceOperators[ii].fed_id;
                m.dest_handle = filtFunc->sourceOperators[ii].handle;
                if ((ii < static_cast<int> (filtFunc->sourceOperators.size() - 1)) ||
                    (filtFunc->finalSourceFilter.fed_id != invalid_fed_id))
                {
                    m.setAction(CMD_SEND_FOR_FILTER_OPERATION);
                }
                else
                {
                    m.setAction(CMD_SEND_FOR_FILTER);
                }
                return m;
                */
        }
    }
}